

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O1

void __thiscall gl4cts::KHRDebug::TestBase::done(TestBase *this)

{
  this->m_test_base_context->m_renderCtx = this->m_orig_rc;
  if (this->m_rc != (RenderContext *)0x0) {
    (*this->m_rc->_vptr_RenderContext[1])();
  }
  (*this->m_test_base_context->m_renderCtx->_vptr_RenderContext[8])();
  this->m_rc = (RenderContext *)0x0;
  this->m_gl = (Functions *)0x0;
  return;
}

Assistant:

void TestBase::done()
{
	/* Delete context used by test */
	m_test_base_context.setRenderContext(m_orig_rc);

	delete m_rc;

	/* Switch back to original context */
	m_test_base_context.getRenderContext().makeCurrent();

	m_rc = 0;
	m_gl = 0;
}